

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-traits.cpp
# Opt level: O0

bool ggml_cpu_extra_work_size(int n_threads,ggml_tensor *op,size_t *size)

{
  ggml_backend_buffer_type *pgVar1;
  _Bool _Var2;
  reference ppgVar3;
  ulong uVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  tensor_traits *tensor_traits;
  extra_buffer_type *buf_extra;
  ggml_backend_buffer_type *extra;
  iterator __end1;
  iterator __begin1;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *__range1;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
  local_28;
  vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined4 local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  local_20 = ggml_backend_cpu_get_extra_buffers_type();
  local_28._M_current =
       (ggml_backend_buffer_type **)
       std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>::end
            (in_stack_ffffffffffffffb8);
  do {
    _Var2 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!_Var2) {
      return false;
    }
    ppgVar3 = __gnu_cxx::
              __normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
              ::operator*(&local_28);
    pgVar1 = *ppgVar3;
    if ((pgVar1 != (ggml_backend_buffer_type *)0x0) && (pgVar1->context != (void *)0x0)) {
      in_stack_ffffffffffffffc0 =
           (__normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
            *)pgVar1->context;
      in_stack_ffffffffffffffb8 =
           (vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)
           (*(code *)in_stack_ffffffffffffffc0->_M_current[3])(in_stack_ffffffffffffffc0,local_10);
      if ((in_stack_ffffffffffffffb8 !=
           (vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_> *)0x0)
         && (uVar4 = (*(code *)(in_stack_ffffffffffffffb8->
                               super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
                               )._M_impl.super__Vector_impl_data._M_start[2])
                               (in_stack_ffffffffffffffb8,local_8,local_10,local_18),
            (uVar4 & 1) != 0)) {
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<ggml_backend_buffer_type_**,_std::vector<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>_>
    ::operator++(&local_28);
  } while( true );
}

Assistant:

bool ggml_cpu_extra_work_size(int n_threads, const struct ggml_tensor * op, size_t * size) {
    for (auto extra : ggml_backend_cpu_get_extra_buffers_type()) {
        if (extra && extra->context) {
            auto buf_extra     = (ggml::cpu::extra_buffer_type *) extra->context;
            auto tensor_traits = buf_extra->get_tensor_traits(op);
            if (tensor_traits && tensor_traits->work_size(n_threads, op, *size)) {
                return true;
            }
        }
    }
    return false;
}